

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_function.cpp
# Opt level: O2

void __thiscall
duckdb::ScalarFunction::ScalarFunction
          (ScalarFunction *this,vector<duckdb::LogicalType,_true> *arguments,
          LogicalType *return_type,scalar_function_t *function,bind_scalar_function_t bind,
          bind_scalar_function_extended_t bind_extended,function_statistics_t statistics,
          init_local_state_t init_local_state,LogicalType varargs,FunctionStability side_effects,
          FunctionNullHandling null_handling,bind_lambda_function_t bind_lambda)

{
  _Manager_type p_Var1;
  LogicalType varargs_00;
  FunctionNullHandling null_handling_00;
  bind_lambda_function_t in_stack_ffffffffffffff38;
  _Any_data local_b8;
  _Manager_type local_a8;
  _Invoker_type local_a0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_98;
  LogicalType local_80;
  string local_68;
  LogicalType local_48;
  
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start =
       (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_start;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_finish;
  local_98.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
       super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
       super__Vector_impl_data._M_end_of_storage;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (arguments->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>).
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  LogicalType::LogicalType(&local_80,return_type);
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a8 = (_Manager_type)0x0;
  local_a0 = function->_M_invoker;
  p_Var1 = (function->super__Function_base)._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    local_b8._M_unused._0_8_ =
         (undefined8)*(undefined8 *)&(function->super__Function_base)._M_functor;
    local_b8._8_8_ = *(undefined8 *)((long)&(function->super__Function_base)._M_functor + 8);
    (function->super__Function_base)._M_manager = (_Manager_type)0x0;
    function->_M_invoker = (_Invoker_type)0x0;
    local_a8 = p_Var1;
  }
  null_handling_00 = 0xa3;
  LogicalType::LogicalType(&local_48,(LogicalType *)varargs._0_8_);
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_ =
       varargs.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_1_;
  varargs_00._0_8_ = &local_48;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr._1_7_ = 0;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_ =
       varargs.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._0_1_
  ;
  varargs_00.type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi._1_7_ = 0;
  ScalarFunction(this,&local_68,(vector<duckdb::LogicalType,_true> *)&local_98,&local_80,
                 (scalar_function_t *)&local_b8,bind,bind_extended,statistics,init_local_state,
                 varargs_00,side_effects,null_handling_00,in_stack_ffffffffffffff38);
  LogicalType::~LogicalType(&local_48);
  ::std::_Function_base::~_Function_base((_Function_base *)&local_b8);
  LogicalType::~LogicalType(&local_80);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_98);
  ::std::__cxx11::string::~string((string *)&local_68);
  return;
}

Assistant:

ScalarFunction::ScalarFunction(vector<LogicalType> arguments, LogicalType return_type, scalar_function_t function,
                               bind_scalar_function_t bind, bind_scalar_function_extended_t bind_extended,
                               function_statistics_t statistics, init_local_state_t init_local_state,
                               LogicalType varargs, FunctionStability side_effects, FunctionNullHandling null_handling,
                               bind_lambda_function_t bind_lambda)
    : ScalarFunction(string(), std::move(arguments), std::move(return_type), std::move(function), bind, bind_extended,
                     statistics, init_local_state, std::move(varargs), side_effects, null_handling, bind_lambda) {
}